

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_unhash.cpp
# Opt level: O0

void ritobin::BinUnhasherVisit::value(BinUnhasher *unhasher,Embed *value,int max_depth)

{
  bool bVar1;
  reference value_00;
  Field *item;
  iterator __end2;
  iterator __begin2;
  FieldList *__range2;
  int max_depth_local;
  Embed *value_local;
  BinUnhasher *unhasher_local;
  
  BinUnhasher::unhash_hash(unhasher,&value->name);
  __end2 = std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>::begin(&value->items);
  item = (Field *)std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>::end(&value->items);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<ritobin::Field_*,_std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>_>
                      (&__end2,(__normal_iterator<ritobin::Field_*,_std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>_>
                                *)&item);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    value_00 = __gnu_cxx::
               __normal_iterator<ritobin::Field_*,_std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>_>
               ::operator*(&__end2);
    BinUnhasher::unhash_hash(unhasher,&value_00->key);
    BinUnhasher::unhash_value(unhasher,&value_00->value,max_depth);
    __gnu_cxx::
    __normal_iterator<ritobin::Field_*,_std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

static void value(BinUnhasher const& unhasher, Embed& value, int max_depth) noexcept {
            unhasher.unhash_hash(value.name);
            for (auto& item : value.items) {
                unhasher.unhash_hash(item.key);
                unhasher.unhash_value(item.value, max_depth);
            }
        }